

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O0

void __thiscall
TPZStream::Read<int>(TPZStream *this,set<int,_std::less<int>,_std::allocator<int>_> *vec)

{
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  long *in_RDI;
  int val;
  int i;
  int nel;
  undefined1 local_1c [4];
  int iVar1;
  int in_stack_ffffffffffffffec;
  
  (**(code **)(*in_RDI + 0xe8))(in_RDI,&stack0xffffffffffffffec,1);
  for (iVar1 = 0; iVar1 < in_stack_ffffffffffffffec; iVar1 = iVar1 + 1) {
    (**(code **)(*in_RDI + 0xe8))(in_RDI,local_1c,1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              (in_RSI,(value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffffec,iVar1));
  }
  return;
}

Assistant:

void Read(std::set<T> &vec) {
        if constexpr (std::is_same<std::string, T>::value || is_arithmetic_pz<T>::value){
        int nel;
        this->Read(&nel, 1);
        for (int i = 0; i < nel; i++) {
            T val;
            this->Read(&val);
            vec.insert(val);
        }
        }else{
            DebugStop();
        }
    }